

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_fastcgi_module.c
# Opt level: O3

ngx_int_t ngx_http_fastcgi_process_header(ngx_http_request_t *r)

{
  size_t *psVar1;
  ngx_buf_t *b;
  ngx_http_fastcgi_ctx_t *f;
  ngx_hash_t *hash;
  ngx_http_upstream_t *pnVar2;
  byte *s1;
  ngx_http_cache_t *pnVar3;
  size_t sVar4;
  ngx_table_elt_t *pnVar5;
  ngx_http_upstream_state_t *pnVar6;
  bool bVar7;
  bool bVar8;
  byte bVar9;
  ngx_http_fastcgi_state_e nVar10;
  ngx_int_t nVar11;
  byte *pbVar12;
  u_char *puVar13;
  byte *pbVar14;
  byte *pbVar15;
  u_char *puVar16;
  u_char *puVar17;
  ngx_uint_t *pnVar18;
  ngx_uint_t nVar19;
  void *pvVar20;
  long lVar21;
  ngx_array_t *pnVar22;
  u_char *__src;
  long *plVar23;
  ngx_uint_t nVar24;
  char *pcVar25;
  u_char *puVar26;
  size_t sVar27;
  ngx_log_t *pnVar28;
  ngx_str_t *pnVar29;
  undefined8 *puVar30;
  long *plVar31;
  ulong uVar32;
  undefined1 local_e0 [8];
  ngx_buf_t buf;
  u_char *local_48;
  ngx_int_t local_38;
  
  f = (ngx_http_fastcgi_ctx_t *)r->ctx[ngx_http_fastcgi_module.ctx_index];
  hash = (ngx_hash_t *)r->main_conf[ngx_http_upstream_module.ctx_index];
  pnVar2 = r->upstream;
  b = &pnVar2->buffer;
  buf._72_8_ = &pnVar2->headers_in;
LAB_00174249:
  do {
    while( true ) {
      nVar10 = f->state;
      if (ngx_http_fastcgi_st_reserved < nVar10) goto LAB_001742c3;
      puVar16 = (pnVar2->buffer).pos;
      puVar13 = (pnVar2->buffer).last;
      while( true ) {
        f->pos = puVar16;
        f->last = puVar13;
        nVar11 = ngx_http_fastcgi_process_record(r,f);
        (pnVar2->buffer).pos = f->pos;
        (pnVar2->buffer).last = f->last;
        if (nVar11 == -2) {
          return -2;
        }
        if (nVar11 == -1) {
          return 0x28;
        }
        pnVar29 = (ngx_str_t *)f->type;
        if (((ulong)pnVar29 & 0xfffffffffffffffe) != 6) {
          pnVar28 = r->connection->log;
          if (pnVar28->log_level < 4) {
            return 0x28;
          }
          pcVar25 = "upstream sent unexpected FastCGI record: %ui";
          goto LAB_00174a13;
        }
        if ((pnVar29 == (ngx_str_t *)0x6) && (f->length == 0)) {
          pnVar28 = r->connection->log;
          if (pnVar28->log_level < 4) {
            return 0x28;
          }
          pcVar25 = "upstream prematurely closed FastCGI stdout";
          goto LAB_00174a49;
        }
        nVar10 = f->state;
LAB_001742c3:
        if (nVar10 != ngx_http_fastcgi_st_padding) break;
        puVar26 = (pnVar2->buffer).pos;
        puVar13 = (pnVar2->buffer).last;
        puVar16 = puVar26 + f->padding;
        if (puVar13 <= puVar16) {
          if (puVar16 == puVar13) {
            f->state = ngx_http_fastcgi_st_version;
          }
          else {
            f->padding = (size_t)(puVar26 + (f->padding - (long)puVar13));
          }
          b->pos = puVar13;
          return -2;
        }
        f->state = ngx_http_fastcgi_st_version;
        b->pos = puVar16;
      }
      if (f->type == 7) break;
      bVar9 = f->field_0x40;
      if (((bVar9 & 2) != 0) && (pnVar3 = r->cache, pnVar3 != (ngx_http_cache_t *)0x0)) {
        puVar13 = (pnVar2->buffer).start + pnVar3->header_start;
        puVar16 = (pnVar2->buffer).pos;
        puVar26 = puVar16 + (-0x10 - (long)puVar13);
        if ((long)puVar26 < 0) {
          pnVar3->header_start = (size_t)(puVar16 + (pnVar3->header_start - (long)puVar13) + -8);
        }
        else {
          puVar13[0] = '\x01';
          puVar13[1] = '\a';
          puVar13[2] = '\0';
          puVar13[3] = '\x01';
          puVar13[4] = (u_char)((ulong)puVar26 >> 8);
          puVar13[5] = (u_char)puVar26;
          puVar13[6] = '\0';
          puVar13[7] = '\0';
        }
        bVar9 = f->field_0x40 & 0xfd;
      }
      f->field_0x40 = bVar9 | 1;
      puVar16 = (pnVar2->buffer).pos;
      puVar13 = (pnVar2->buffer).last;
      puVar17 = puVar16 + f->length;
      puVar26 = puVar16;
      if (puVar17 < puVar13) {
        (pnVar2->buffer).last = puVar17;
        local_48 = puVar13;
      }
      else {
        local_48 = (u_char *)0x0;
        puVar17 = puVar13;
      }
      do {
        __src = puVar26;
        puVar13 = puVar17;
        nVar11 = ngx_http_parse_header_line(r,b,1);
        pnVar28 = r->connection->log;
        if ((pnVar28->log_level & 0x100) != 0) {
          ngx_log_error_core(8,pnVar28,0,"http fastcgi parser: %i",nVar11);
        }
        if (nVar11 != 0) {
          if (nVar11 == -2) {
            bVar8 = false;
            goto LAB_00174877;
          }
          if (nVar11 != 1) {
            pnVar28 = r->connection->log;
            if (pnVar28->log_level < 4) {
              return 0x28;
            }
            pcVar25 = "upstream sent invalid header";
LAB_00174a49:
            local_38 = 0x28;
            nVar19 = 4;
LAB_00174a6b:
            ngx_log_error_core(nVar19,pnVar28,0,pcVar25);
            return local_38;
          }
          pnVar28 = r->connection->log;
          if ((pnVar28->log_level & 0x100) != 0) {
            ngx_log_error_core(8,pnVar28,0,"http fastcgi header done");
          }
          pnVar5 = (pnVar2->headers_in).status;
          if (pnVar5 == (ngx_table_elt_t *)0x0) {
            if ((pnVar2->headers_in).location == (ngx_table_elt_t *)0x0) {
              (pnVar2->headers_in).status_n = 200;
              (pnVar2->headers_in).status_line.len = 6;
              (pnVar2->headers_in).status_line.data = (u_char *)"200 OK";
              nVar19 = 200;
            }
            else {
              (pnVar2->headers_in).status_n = 0x12e;
              (pnVar2->headers_in).status_line.len = 0x15;
              (pnVar2->headers_in).status_line.data = (u_char *)"302 Moved Temporarily";
              nVar19 = 0x12e;
            }
          }
          else {
            pnVar29 = &pnVar5->value;
            nVar19 = ngx_atoi((pnVar5->value).data,3);
            if (nVar19 == 0xffffffffffffffff) {
              pnVar28 = r->connection->log;
              if (pnVar28->log_level < 4) {
                return 0x28;
              }
              pcVar25 = "upstream sent invalid status \"%V\"";
LAB_00174a13:
              ngx_log_error_core(4,pnVar28,0,pcVar25,pnVar29);
              return 0x28;
            }
            (pnVar2->headers_in).status_n = nVar19;
            puVar26 = (pnVar5->value).data;
            (pnVar2->headers_in).status_line.len = pnVar29->len;
            (pnVar2->headers_in).status_line.data = puVar26;
          }
          pnVar6 = pnVar2->state;
          bVar7 = true;
          if ((pnVar6 != (ngx_http_upstream_state_t *)0x0) && (pnVar6->status == 0)) {
            pnVar6->status = nVar19;
          }
          bVar8 = false;
          goto LAB_00174900;
        }
        pnVar18 = (ngx_uint_t *)ngx_list_push((ngx_list_t *)buf._72_8_);
        local_38 = -1;
        if (pnVar18 == (ngx_uint_t *)0x0) {
          return -1;
        }
        pnVar22 = f->split_parts;
        if ((pnVar22 == (ngx_array_t *)0x0) || (nVar19 = pnVar22->nelts, nVar19 == 0)) {
          nVar19 = (long)r->header_name_end - (long)r->header_name_start;
          pnVar18[1] = nVar19;
          nVar24 = (long)r->header_end - (long)r->header_start;
          pnVar18[3] = nVar24;
          pvVar20 = ngx_pnalloc(r->pool,nVar24 + nVar19 * 2 + 2);
          pnVar18[2] = (ngx_uint_t)pvVar20;
          if (pvVar20 == (void *)0x0) {
            return -1;
          }
          sVar4 = pnVar18[1];
          pnVar18[4] = (long)pvVar20 + sVar4 + 1;
          pnVar18[5] = (long)pvVar20 + pnVar18[3] + sVar4 + 2;
          memcpy(pvVar20,r->header_name_start,sVar4);
          *(undefined1 *)(pnVar18[2] + pnVar18[1]) = 0;
          memcpy((void *)pnVar18[4],r->header_start,pnVar18[3]);
          *(undefined1 *)(pnVar18[4] + pnVar18[3]) = 0;
        }
        else {
          sVar27 = (long)b->pos - (long)__src;
          plVar31 = (long *)((long)pnVar22->elts + 8);
          plVar23 = plVar31;
          do {
            sVar27 = (sVar27 + *plVar23) - plVar23[-1];
            plVar23 = plVar23 + 2;
            nVar19 = nVar19 - 1;
          } while (nVar19 != 0);
          puVar26 = (u_char *)ngx_pnalloc(r->pool,sVar27);
          if (puVar26 == (u_char *)0x0) {
            return -1;
          }
          local_e0 = (undefined1  [8])puVar26;
          if (f->split_parts->nelts != 0) {
            uVar32 = 0;
            do {
              memcpy(puVar26,(void *)plVar31[-1],*plVar31 - plVar31[-1]);
              puVar26 = puVar26 + (*plVar31 - plVar31[-1]);
              uVar32 = uVar32 + 1;
              plVar31 = plVar31 + 2;
            } while (uVar32 < f->split_parts->nelts);
          }
          memcpy(puVar26,__src,(long)b->pos - (long)__src);
          buf.pos = puVar26 + ((long)b->pos - (long)__src);
          f->split_parts->nelts = 0;
          nVar11 = ngx_http_parse_header_line(r,(ngx_buf_t *)local_e0,1);
          if (nVar11 != 0) {
            pnVar28 = r->connection->log;
            if (pnVar28->log_level < 2) {
              return -1;
            }
            pcVar25 = "invalid header after joining FastCGI records";
            nVar19 = 2;
            goto LAB_00174a6b;
          }
          puVar26 = r->header_name_start;
          puVar17 = r->header_name_end;
          pnVar18[1] = (long)puVar17 - (long)puVar26;
          pnVar18[2] = (ngx_uint_t)puVar26;
          *puVar17 = '\0';
          puVar26 = r->header_start;
          puVar17 = r->header_end;
          pnVar18[3] = (long)puVar17 - (long)puVar26;
          pnVar18[4] = (ngx_uint_t)puVar26;
          *puVar17 = '\0';
          pvVar20 = ngx_pnalloc(r->pool,pnVar18[1]);
          pnVar18[5] = (ngx_uint_t)pvVar20;
          if (pvVar20 == (void *)0x0) {
            return -1;
          }
        }
        *pnVar18 = r->header_hash;
        sVar4 = pnVar18[1];
        if (sVar4 == r->lowcase_index) {
          memcpy((u_char *)pnVar18[5],r->lowcase_header,sVar4);
        }
        else {
          ngx_strlow((u_char *)pnVar18[5],(u_char *)pnVar18[2],sVar4);
        }
        pvVar20 = ngx_hash_find(hash,*pnVar18,(u_char *)pnVar18[5],pnVar18[1]);
        if ((pvVar20 != (void *)0x0) &&
           (lVar21 = (**(code **)((long)pvVar20 + 0x10))
                               (r,pnVar18,*(undefined8 *)((long)pvVar20 + 0x18)), lVar21 != 0)) {
          return -1;
        }
        pnVar28 = r->connection->log;
        if ((pnVar28->log_level & 0x100) != 0) {
          ngx_log_error_core(8,pnVar28,0,"http fastcgi header: \"%V: %V\"",pnVar18 + 1,pnVar18 + 3);
        }
        puVar26 = (pnVar2->buffer).pos;
        puVar17 = (pnVar2->buffer).last;
      } while (puVar26 < puVar17);
      bVar8 = true;
LAB_00174877:
      bVar7 = false;
LAB_00174900:
      if (local_48 != (u_char *)0x0) {
        (pnVar2->buffer).last = local_48;
      }
      psVar1 = &f->length;
      *psVar1 = (size_t)(puVar16 + (*psVar1 - (long)b->pos));
      if (*psVar1 == 0) {
        f->state = ngx_http_fastcgi_st_padding;
      }
      if (bVar7) {
        return 0;
      }
      if (!bVar8) {
        pnVar28 = r->connection->log;
        if ((pnVar28->log_level & 0x100) != 0) {
          ngx_log_error_core(8,pnVar28,0,"upstream split a header line in FastCGI records");
        }
        pnVar22 = f->split_parts;
        if (pnVar22 == (ngx_array_t *)0x0) {
          pnVar22 = ngx_array_create(r->pool,1,0x10);
          f->split_parts = pnVar22;
          if (pnVar22 == (ngx_array_t *)0x0) {
            return -1;
          }
        }
        puVar30 = (undefined8 *)ngx_array_push(pnVar22);
        if (puVar30 == (undefined8 *)0x0) {
          return -1;
        }
        *puVar30 = __src;
        puVar30[1] = puVar13;
        if ((pnVar2->buffer).last <= (pnVar2->buffer).pos) {
          return -2;
        }
      }
    }
    sVar27 = f->length;
    if (sVar27 != 0) {
      s1 = (pnVar2->buffer).pos;
      pbVar14 = (pnVar2->buffer).last;
      pbVar15 = s1 + sVar27;
      if (pbVar14 < pbVar15) {
        pbVar12 = s1 + (sVar27 - (long)pbVar14);
        pbVar15 = pbVar14;
      }
      else {
        f->state = ngx_http_fastcgi_st_padding;
        pbVar12 = (byte *)0x0;
      }
      f->length = (size_t)pbVar12;
      b->pos = pbVar15;
      pbVar14 = pbVar15 + -1;
      if (s1 < pbVar14) {
        do {
          if ((0x2e < (ulong)*pbVar14) || ((0x400100002400U >> ((ulong)*pbVar14 & 0x3f) & 1) == 0))
          break;
          pbVar14 = pbVar14 + -1;
        } while (s1 < pbVar14);
        pbVar15 = pbVar14 + 1;
      }
      pnVar28 = r->connection->log;
      if (3 < pnVar28->log_level) {
        ngx_log_error_core(4,pnVar28,0,"FastCGI sent in stderr: \"%*s\"",(long)pbVar15 - (long)s1,s1
                          );
      }
      pvVar20 = r->loc_conf[ngx_http_fastcgi_module.ctx_index];
      plVar23 = *(long **)((long)pvVar20 + 0x230);
      if ((plVar23 != (long *)0x0) && (plVar23[1] != 0)) {
        puVar30 = (undefined8 *)(*plVar23 + 8);
        uVar32 = 0;
        do {
          puVar16 = ngx_strnstr(s1,(char *)*puVar30,(long)pbVar15 - (long)s1);
          if (puVar16 != (u_char *)0x0) {
            return 0x28;
          }
          uVar32 = uVar32 + 1;
          puVar30 = puVar30 + 2;
        } while (uVar32 < *(ulong *)(*(long *)((long)pvVar20 + 0x230) + 8));
      }
      if ((pnVar2->buffer).pos == (pnVar2->buffer).last) {
        if ((f->field_0x40 & 1) != 0) {
          return -2;
        }
        puVar16 = (pnVar2->buffer).start;
        if (r->cache != (ngx_http_cache_t *)0x0) {
          puVar16 = puVar16 + r->cache->header_start;
        }
        (pnVar2->buffer).pos = puVar16;
        (pnVar2->buffer).last = puVar16;
        f->field_0x40 = f->field_0x40 | 2;
        return -2;
      }
      goto LAB_00174249;
    }
    f->state = ngx_http_fastcgi_st_padding;
  } while( true );
}

Assistant:

static ngx_int_t
ngx_http_fastcgi_process_header(ngx_http_request_t *r)
{
    u_char                         *p, *msg, *start, *last,
                                   *part_start, *part_end;
    size_t                          size;
    ngx_str_t                      *status_line, *pattern;
    ngx_int_t                       rc, status;
    ngx_buf_t                       buf;
    ngx_uint_t                      i;
    ngx_table_elt_t                *h;
    ngx_http_upstream_t            *u;
    ngx_http_fastcgi_ctx_t         *f;
    ngx_http_upstream_header_t     *hh;
    ngx_http_fastcgi_loc_conf_t    *flcf;
    ngx_http_fastcgi_split_part_t  *part;
    ngx_http_upstream_main_conf_t  *umcf;

    f = ngx_http_get_module_ctx(r, ngx_http_fastcgi_module);

    umcf = ngx_http_get_module_main_conf(r, ngx_http_upstream_module);

    u = r->upstream;

    for ( ;; ) {

        if (f->state < ngx_http_fastcgi_st_data) {

            f->pos = u->buffer.pos;
            f->last = u->buffer.last;

            rc = ngx_http_fastcgi_process_record(r, f);

            u->buffer.pos = f->pos;
            u->buffer.last = f->last;

            if (rc == NGX_AGAIN) {
                return NGX_AGAIN;
            }

            if (rc == NGX_ERROR) {
                return NGX_HTTP_UPSTREAM_INVALID_HEADER;
            }

            if (f->type != NGX_HTTP_FASTCGI_STDOUT
                && f->type != NGX_HTTP_FASTCGI_STDERR)
            {
                ngx_log_error(NGX_LOG_ERR, r->connection->log, 0,
                              "upstream sent unexpected FastCGI record: %ui",
                              f->type);

                return NGX_HTTP_UPSTREAM_INVALID_HEADER;
            }

            if (f->type == NGX_HTTP_FASTCGI_STDOUT && f->length == 0) {
                ngx_log_error(NGX_LOG_ERR, r->connection->log, 0,
                              "upstream prematurely closed FastCGI stdout");

                return NGX_HTTP_UPSTREAM_INVALID_HEADER;
            }
        }

        if (f->state == ngx_http_fastcgi_st_padding) {

            if (u->buffer.pos + f->padding < u->buffer.last) {
                f->state = ngx_http_fastcgi_st_version;
                u->buffer.pos += f->padding;

                continue;
            }

            if (u->buffer.pos + f->padding == u->buffer.last) {
                f->state = ngx_http_fastcgi_st_version;
                u->buffer.pos = u->buffer.last;

                return NGX_AGAIN;
            }

            f->padding -= u->buffer.last - u->buffer.pos;
            u->buffer.pos = u->buffer.last;

            return NGX_AGAIN;
        }


        /* f->state == ngx_http_fastcgi_st_data */

        if (f->type == NGX_HTTP_FASTCGI_STDERR) {

            if (f->length) {
                msg = u->buffer.pos;

                if (u->buffer.pos + f->length <= u->buffer.last) {
                    u->buffer.pos += f->length;
                    f->length = 0;
                    f->state = ngx_http_fastcgi_st_padding;

                } else {
                    f->length -= u->buffer.last - u->buffer.pos;
                    u->buffer.pos = u->buffer.last;
                }

                for (p = u->buffer.pos - 1; msg < p; p--) {
                    if (*p != LF && *p != CR && *p != '.' && *p != ' ') {
                        break;
                    }
                }

                p++;

                ngx_log_error(NGX_LOG_ERR, r->connection->log, 0,
                              "FastCGI sent in stderr: \"%*s\"", p - msg, msg);

                flcf = ngx_http_get_module_loc_conf(r, ngx_http_fastcgi_module);

                if (flcf->catch_stderr) {
                    pattern = flcf->catch_stderr->elts;

                    for (i = 0; i < flcf->catch_stderr->nelts; i++) {
                        if (ngx_strnstr(msg, (char *) pattern[i].data,
                                        p - msg)
                            != NULL)
                        {
                            return NGX_HTTP_UPSTREAM_INVALID_HEADER;
                        }
                    }
                }

                if (u->buffer.pos == u->buffer.last) {

                    if (!f->fastcgi_stdout) {

                        /*
                         * the special handling the large number
                         * of the PHP warnings to not allocate memory
                         */

#if (NGX_HTTP_CACHE)
                        if (r->cache) {
                            u->buffer.pos = u->buffer.start
                                                     + r->cache->header_start;
                        } else {
                            u->buffer.pos = u->buffer.start;
                        }
#else
                        u->buffer.pos = u->buffer.start;
#endif
                        u->buffer.last = u->buffer.pos;
                        f->large_stderr = 1;
                    }

                    return NGX_AGAIN;
                }

            } else {
                f->state = ngx_http_fastcgi_st_padding;
            }

            continue;
        }


        /* f->type == NGX_HTTP_FASTCGI_STDOUT */

#if (NGX_HTTP_CACHE)

        if (f->large_stderr && r->cache) {
            ssize_t                     len;
            ngx_http_fastcgi_header_t  *fh;

            start = u->buffer.start + r->cache->header_start;

            len = u->buffer.pos - start - 2 * sizeof(ngx_http_fastcgi_header_t);

            /*
             * A tail of large stderr output before HTTP header is placed
             * in a cache file without a FastCGI record header.
             * To workaround it we put a dummy FastCGI record header at the
             * start of the stderr output or update r->cache_header_start,
             * if there is no enough place for the record header.
             */

            if (len >= 0) {
                fh = (ngx_http_fastcgi_header_t *) start;
                fh->version = 1;
                fh->type = NGX_HTTP_FASTCGI_STDERR;
                fh->request_id_hi = 0;
                fh->request_id_lo = 1;
                fh->content_length_hi = (u_char) ((len >> 8) & 0xff);
                fh->content_length_lo = (u_char) (len & 0xff);
                fh->padding_length = 0;
                fh->reserved = 0;

            } else {
                r->cache->header_start += u->buffer.pos - start
                                          - sizeof(ngx_http_fastcgi_header_t);
            }

            f->large_stderr = 0;
        }

#endif

        f->fastcgi_stdout = 1;

        start = u->buffer.pos;

        if (u->buffer.pos + f->length < u->buffer.last) {

            /*
             * set u->buffer.last to the end of the FastCGI record data
             * for ngx_http_parse_header_line()
             */

            last = u->buffer.last;
            u->buffer.last = u->buffer.pos + f->length;

        } else {
            last = NULL;
        }

        for ( ;; ) {

            part_start = u->buffer.pos;
            part_end = u->buffer.last;

            rc = ngx_http_parse_header_line(r, &u->buffer, 1);

            ngx_log_debug1(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                           "http fastcgi parser: %i", rc);

            if (rc == NGX_AGAIN) {
                break;
            }

            if (rc == NGX_OK) {

                /* a header line has been parsed successfully */

                h = ngx_list_push(&u->headers_in.headers);
                if (h == NULL) {
                    return NGX_ERROR;
                }

                if (f->split_parts && f->split_parts->nelts) {

                    part = f->split_parts->elts;
                    size = u->buffer.pos - part_start;

                    for (i = 0; i < f->split_parts->nelts; i++) {
                        size += part[i].end - part[i].start;
                    }

                    p = ngx_pnalloc(r->pool, size);
                    if (p == NULL) {
                        return NGX_ERROR;
                    }

                    buf.pos = p;

                    for (i = 0; i < f->split_parts->nelts; i++) {
                        p = ngx_cpymem(p, part[i].start,
                                       part[i].end - part[i].start);
                    }

                    p = ngx_cpymem(p, part_start, u->buffer.pos - part_start);

                    buf.last = p;

                    f->split_parts->nelts = 0;

                    rc = ngx_http_parse_header_line(r, &buf, 1);

                    if (rc != NGX_OK) {
                        ngx_log_error(NGX_LOG_ALERT, r->connection->log, 0,
                                      "invalid header after joining "
                                      "FastCGI records");
                        return NGX_ERROR;
                    }

                    h->key.len = r->header_name_end - r->header_name_start;
                    h->key.data = r->header_name_start;
                    h->key.data[h->key.len] = '\0';

                    h->value.len = r->header_end - r->header_start;
                    h->value.data = r->header_start;
                    h->value.data[h->value.len] = '\0';

                    h->lowcase_key = ngx_pnalloc(r->pool, h->key.len);
                    if (h->lowcase_key == NULL) {
                        return NGX_ERROR;
                    }

                } else {

                    h->key.len = r->header_name_end - r->header_name_start;
                    h->value.len = r->header_end - r->header_start;

                    h->key.data = ngx_pnalloc(r->pool,
                                              h->key.len + 1 + h->value.len + 1
                                              + h->key.len);
                    if (h->key.data == NULL) {
                        return NGX_ERROR;
                    }

                    h->value.data = h->key.data + h->key.len + 1;
                    h->lowcase_key = h->key.data + h->key.len + 1
                                     + h->value.len + 1;

                    ngx_memcpy(h->key.data, r->header_name_start, h->key.len);
                    h->key.data[h->key.len] = '\0';
                    ngx_memcpy(h->value.data, r->header_start, h->value.len);
                    h->value.data[h->value.len] = '\0';
                }

                h->hash = r->header_hash;

                if (h->key.len == r->lowcase_index) {
                    ngx_memcpy(h->lowcase_key, r->lowcase_header, h->key.len);

                } else {
                    ngx_strlow(h->lowcase_key, h->key.data, h->key.len);
                }

                hh = ngx_hash_find(&umcf->headers_in_hash, h->hash,
                                   h->lowcase_key, h->key.len);

                if (hh && hh->handler(r, h, hh->offset) != NGX_OK) {
                    return NGX_ERROR;
                }

                ngx_log_debug2(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                               "http fastcgi header: \"%V: %V\"",
                               &h->key, &h->value);

                if (u->buffer.pos < u->buffer.last) {
                    continue;
                }

                /* the end of the FastCGI record */

                break;
            }

            if (rc == NGX_HTTP_PARSE_HEADER_DONE) {

                /* a whole header has been parsed successfully */

                ngx_log_debug0(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                               "http fastcgi header done");

                if (u->headers_in.status) {
                    status_line = &u->headers_in.status->value;

                    status = ngx_atoi(status_line->data, 3);

                    if (status == NGX_ERROR) {
                        ngx_log_error(NGX_LOG_ERR, r->connection->log, 0,
                                      "upstream sent invalid status \"%V\"",
                                      status_line);
                        return NGX_HTTP_UPSTREAM_INVALID_HEADER;
                    }

                    u->headers_in.status_n = status;
                    u->headers_in.status_line = *status_line;

                } else if (u->headers_in.location) {
                    u->headers_in.status_n = 302;
                    ngx_str_set(&u->headers_in.status_line,
                                "302 Moved Temporarily");

                } else {
                    u->headers_in.status_n = 200;
                    ngx_str_set(&u->headers_in.status_line, "200 OK");
                }

                if (u->state && u->state->status == 0) {
                    u->state->status = u->headers_in.status_n;
                }

                break;
            }

            /* there was error while a header line parsing */

            ngx_log_error(NGX_LOG_ERR, r->connection->log, 0,
                          "upstream sent invalid header");

            return NGX_HTTP_UPSTREAM_INVALID_HEADER;
        }

        if (last) {
            u->buffer.last = last;
        }

        f->length -= u->buffer.pos - start;

        if (f->length == 0) {
            f->state = ngx_http_fastcgi_st_padding;
        }

        if (rc == NGX_HTTP_PARSE_HEADER_DONE) {
            return NGX_OK;
        }

        if (rc == NGX_OK) {
            continue;
        }

        /* rc == NGX_AGAIN */

        ngx_log_debug0(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                       "upstream split a header line in FastCGI records");

        if (f->split_parts == NULL) {
            f->split_parts = ngx_array_create(r->pool, 1,
                                        sizeof(ngx_http_fastcgi_split_part_t));
            if (f->split_parts == NULL) {
                return NGX_ERROR;
            }
        }

        part = ngx_array_push(f->split_parts);
        if (part == NULL) {
            return NGX_ERROR;
        }

        part->start = part_start;
        part->end = part_end;

        if (u->buffer.pos < u->buffer.last) {
            continue;
        }

        return NGX_AGAIN;
    }
}